

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_util.cc
# Opt level: O2

int raptor_sockaddr_set_port(raptor_resolved_address *resolved_addr,int port)

{
  ushort uVar1;
  char *format;
  int line;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)port;
  if ((uint)port < 0x10000) {
    uVar1 = *(ushort *)resolved_addr->addr;
    uVar2 = (ulong)uVar1;
    if ((uVar1 == 10) || (uVar1 == 2)) {
      *(ushort *)(resolved_addr->addr + 2) = (ushort)port << 8 | (ushort)port >> 8;
      return 1;
    }
    format = "Unknown socket family %d in raptor_sockaddr_set_port";
    line = 0x109;
  }
  else {
    format = "Invalid port number: %d";
    line = 0xfb;
  }
  raptor::LogFormatPrint
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/socket_util.cc"
             ,line,kLogLevelError,format,uVar2);
  return 0;
}

Assistant:

int raptor_sockaddr_set_port(
    const raptor_resolved_address* resolved_addr, int port) {
    const raptor_sockaddr* addr =
        reinterpret_cast<const raptor_sockaddr*>(resolved_addr->addr);
    if (!(port >= 0 && port < 65536)) {
        log_error("Invalid port number: %d", port);
        return 0;
    }

    switch (addr->sa_family) {
    case AF_INET:
        ((raptor_sockaddr_in*)addr)->sin_port =
            htons(static_cast<uint16_t>(port));
        return 1;
    case AF_INET6:
        ((raptor_sockaddr_in6*)addr)->sin6_port =
            htons(static_cast<uint16_t>(port));
        return 1;
    default:
        log_error("Unknown socket family %d in raptor_sockaddr_set_port", addr->sa_family);
        return 0;
    }
}